

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X11MiniFB.c
# Opt level: O0

int translate_mod_ex(int key,int state,int is_pressed)

{
  int in_EDX;
  int in_ESI;
  undefined4 in_EDI;
  int mod_keys;
  uint local_10;
  
  local_10 = translate_mod(in_ESI);
  switch(in_EDI) {
  case 0x154:
  case 0x158:
    if (in_EDX == 0) {
      local_10 = local_10 & 0xfffffffe;
    }
    else {
      local_10 = local_10 | 1;
    }
    break;
  case 0x155:
  case 0x159:
    if (in_EDX == 0) {
      local_10 = local_10 & 0xfffffffd;
    }
    else {
      local_10 = local_10 | 2;
    }
    break;
  case 0x156:
  case 0x15a:
    if (in_EDX == 0) {
      local_10 = local_10 & 0xfffffffb;
    }
    else {
      local_10 = local_10 | 4;
    }
    break;
  case 0x157:
  case 0x15b:
    if (in_EDX == 0) {
      local_10 = local_10 & 0xfffffff7;
    }
    else {
      local_10 = local_10 | 8;
    }
  }
  return local_10;
}

Assistant:

int
translate_mod_ex(int key, int state, int is_pressed) {
    int mod_keys = 0;

    mod_keys = translate_mod(state);

    switch (key)
    {
        case KB_KEY_LEFT_SHIFT:
        case KB_KEY_RIGHT_SHIFT:
            if (is_pressed)
                mod_keys |= KB_MOD_SHIFT;
            else
                mod_keys &= ~KB_MOD_SHIFT;
            break;

        case KB_KEY_LEFT_CONTROL:
        case KB_KEY_RIGHT_CONTROL:
            if (is_pressed)
                mod_keys |= KB_MOD_CONTROL;
            else
                mod_keys &= ~KB_MOD_CONTROL;
            break;

        case KB_KEY_LEFT_ALT:
        case KB_KEY_RIGHT_ALT:
            if (is_pressed)
                mod_keys |= KB_MOD_ALT;
            else
                mod_keys &= ~KB_MOD_ALT;
            break;

        case KB_KEY_LEFT_SUPER:
        case KB_KEY_RIGHT_SUPER:
            if (is_pressed)
                mod_keys |= KB_MOD_SUPER;
            else
                mod_keys &= ~KB_MOD_SUPER;
            break;
    }

    return mod_keys;
}